

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.c
# Opt level: O1

void set_wall_state(level *lev)

{
  long lVar1;
  int x;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  char *pcVar6;
  char *pcVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  long lVar17;
  int iVar18;
  ulong uVar19;
  undefined8 in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa8;
  
  pcVar7 = (char *)((long)lev[-1].wtails + 0xdc);
  lVar17 = 0;
  do {
    x = (int)lVar17;
    lVar1 = lVar17 + 1;
    iVar18 = x + 1;
    iVar15 = x + -1;
    uVar16 = 0;
    pcVar6 = pcVar7;
    do {
      uVar4 = (uint)uVar16;
      uVar2 = 0xffffffff;
      iVar14 = iVar18;
      iVar9 = x;
      iVar13 = iVar15;
      iVar3 = iVar18;
      uVar5 = uVar4;
      uVar19 = uVar16;
      switch(pcVar6[0x108]) {
      case '\x01':
        uVar2 = 0;
        goto LAB_0016c9f6;
      case '\x02':
        uVar2 = 1;
        goto LAB_0016c9f6;
      case '\x03':
        uVar2 = uVar4 - 1;
        iVar11 = uVar4 + 1;
        iVar14 = x;
        iVar9 = iVar15;
        uVar5 = uVar2;
        break;
      case '\x04':
        uVar2 = uVar4 - 1;
        iVar11 = uVar4 + 1;
        iVar13 = iVar18;
        uVar5 = uVar2;
        iVar3 = iVar15;
        break;
      case '\x05':
        uVar2 = uVar4 + 1;
        iVar11 = uVar4 - 1;
        iVar14 = iVar15;
        uVar5 = uVar2;
        break;
      case '\x06':
        iVar11 = uVar4 - 1;
        uVar2 = uVar4;
        iVar9 = iVar18;
        iVar13 = x;
        uVar5 = uVar4 + 1;
        uVar19 = (ulong)(uVar4 + 1);
        iVar3 = iVar15;
        break;
      case '\a':
        uVar5 = 1;
        uVar4 = 1;
        if (uVar16 - 1 < 0x15 && x - 2U < 0x4f) {
          uVar4 = (uint)(*pcVar6 == '\x18' || *pcVar6 < '\x11');
        }
        if (lVar17 != 0x4f && uVar16 - 1 < 0x15) {
          uVar5 = (uint)(pcVar6[0x1f8] == '\x18' || pcVar6[0x1f8] < '\x11');
        }
        uVar8 = 1;
        uVar10 = 1;
        if (uVar16 != 0x14 && lVar17 != 0x4f) {
          uVar10 = (uint)(pcVar6[0x210] == '\x18' || pcVar6[0x210] < '\x11');
        }
        if (x - 2U < 0x4f && uVar16 != 0x14) {
          uVar8 = (uint)(pcVar6[0x18] == '\x18' || pcVar6[0x18] < '\x11');
        }
        uVar12 = uVar5 + uVar4 + uVar10;
        if (uVar8 + uVar12 < 2) {
          uVar2 = 1;
          if ((((uVar4 == 0) && (uVar2 = 2, uVar5 == 0)) && (uVar2 = 4, uVar10 == 0)) &&
             (uVar2 = uVar12, uVar8 != 0)) {
            uVar2 = 3;
          }
        }
        else if (((uVar4 == 0) || (uVar10 == 0)) || (uVar2 = 5, uVar8 != 0 || uVar5 != 0)) {
          uVar2 = 0;
          if (uVar10 == 0 && uVar4 == 0) {
            uVar2 = 6;
          }
          if (uVar8 == 0) {
            uVar2 = 0;
          }
          if (uVar5 == 0) {
            uVar2 = 0;
          }
        }
        goto switchD_0016c954_caseD_c;
      case '\b':
        uVar5 = uVar4 + 1;
        iVar11 = uVar4 - 1;
        iVar14 = iVar15;
        iVar13 = iVar11;
        goto LAB_0016cbb2;
      case '\t':
        uVar5 = uVar4 - 1;
        iVar11 = uVar4 + 1;
        iVar3 = iVar15;
        iVar13 = iVar11;
        goto LAB_0016cbb2;
      case '\n':
        iVar11 = uVar4 - 1;
        iVar14 = iVar15;
        iVar3 = iVar15;
        iVar9 = iVar18;
        iVar13 = uVar4 + 1;
        goto LAB_0016cbb2;
      case '\v':
        iVar11 = uVar4 + 1;
        iVar9 = iVar15;
        iVar13 = uVar4 - 1;
LAB_0016cbb2:
        uVar2 = set_twall(lev,iVar9,uVar5,iVar3,iVar11,iVar14,iVar13,(int)in_stack_ffffffffffffffa0,
                          in_stack_ffffffffffffffa8);
      default:
        goto switchD_0016c954_caseD_c;
      case '\x0f':
        uVar2 = *(uint *)(pcVar6 + 0x10a) >> 9 & 1;
LAB_0016c9f6:
        in_stack_ffffffffffffffa0 = 0x16c9fb;
        uVar2 = set_wall(lev,x,uVar4,uVar2);
        goto switchD_0016c954_caseD_c;
      }
      uVar2 = set_corn(lev,iVar9,uVar2,iVar14,uVar5,iVar13,(int)uVar19,iVar3,iVar11);
switchD_0016c954_caseD_c:
      if (-1 < (int)uVar2) {
        *(uint *)(pcVar6 + 0x10a) = *(uint *)(pcVar6 + 0x10a) & 0xffffff8f | (uVar2 & 0x1f) << 4;
      }
      uVar16 = uVar16 + 1;
      pcVar6 = pcVar6 + 0xc;
    } while (uVar16 != 0x15);
    pcVar7 = pcVar7 + 0xfc;
    lVar17 = lVar1;
    if (lVar1 == 0x50) {
      return;
    }
  } while( true );
}

Assistant:

void set_wall_state(struct level *lev)
{
    int x, y;
    int wmode;
    struct rm *loc;

    for (x = 0; x < COLNO; x++)
	for (loc = &lev->locations[x][0], y = 0; y < ROWNO; y++, loc++) {
	    switch (loc->typ) {
		case SDOOR:
		    wmode = set_wall(lev, x, y, (int) loc->horizontal);
		    break;
		case VWALL:
		    wmode = set_wall(lev, x, y, 0);
		    break;
		case HWALL:
		    wmode = set_wall(lev, x, y, 1);
		    break;
		case TDWALL:
		    wmode = set_twall(lev, x,y, x,y-1, x-1,y+1, x+1,y+1);
		    break;
		case TUWALL:
		    wmode = set_twall(lev, x,y, x,y+1, x+1,y-1, x-1,y-1);
		    break;
		case TLWALL:
		    wmode = set_twall(lev, x,y, x+1,y, x-1,y-1, x-1,y+1);
		    break;
		case TRWALL:
		    wmode = set_twall(lev, x,y, x-1,y, x+1,y+1, x+1,y-1);
		    break;
		case TLCORNER:
		    wmode = set_corn(lev, x-1,y-1, x,y-1, x-1,y, x+1,y+1);
		    break;
		case TRCORNER:
		    wmode = set_corn(lev, x,y-1, x+1,y-1, x+1,y, x-1,y+1);
		    break;
		case BLCORNER:
		    wmode = set_corn(lev, x,y+1, x-1,y+1, x-1,y, x+1,y-1);
		    break;
		case BRCORNER:
		    wmode = set_corn(lev, x+1,y, x+1,y+1, x,y+1, x-1,y-1);
		    break;
		case CROSSWALL:
		    wmode = set_crosswall(lev, x, y);
		    break;

		default:
		    wmode = -1;	/* don't set wall info */
		    break;
	    }

	if (wmode >= 0)
	    loc->wall_info = (loc->wall_info & ~WM_MASK) | wmode;
	}
}